

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O3

bool cmAddExecutableCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  cmMakefile *pcVar3;
  bool global;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  undefined8 uVar9;
  long lVar10;
  cmTarget *pcVar11;
  string *psVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  undefined1 local_d8 [32];
  char local_b8 [8];
  char *local_b0;
  cmExecutionStatus *local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  cmMakefile *local_90;
  string *local_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 == psVar2) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0032eb62;
  }
  local_90 = status->Makefile;
  __first._M_current = psVar12 + 1;
  local_a8 = status;
  local_88 = psVar12;
  if (__first._M_current == psVar2) {
    local_98 = 0;
    local_9c = 0;
    local_a0 = 0;
    bVar6 = false;
    bVar5 = false;
    global = false;
  }
  else {
    local_98 = 0;
    local_9c = 0;
    local_a0 = 0;
    bVar6 = false;
    global = false;
    local_94 = 0;
    do {
      uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
      bVar5 = bVar6;
      if ((int)uVar9 == 0) {
        local_98 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
      }
      else {
        uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
        if ((int)uVar9 == 0) {
          local_9c = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        }
        else {
          uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar9 == 0) {
            local_a0 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
          }
          else {
            uVar9 = std::__cxx11::string::compare((char *)__first._M_current);
            if ((int)uVar9 == 0) {
              local_94 = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
            }
            else if (((local_94 & 1) == 0) ||
                    (iVar7 = std::__cxx11::string::compare((char *)__first._M_current), iVar7 != 0))
            {
              iVar7 = std::__cxx11::string::compare((char *)__first._M_current);
              bVar5 = true;
              if (iVar7 != 0) break;
            }
            else {
              global = true;
            }
          }
        }
      }
      bVar6 = bVar5;
      __first._M_current = __first._M_current + 1;
    } while (__first._M_current !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    psVar12 = local_88;
    if ((local_94 & 1) == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (global == false) {
        global = cmMakefile::IsImportedTargetGlobalScope(local_90);
      }
    }
  }
  bVar4 = cmGeneratorExpression::IsValidTargetName(psVar12);
  if (bVar4) {
    bVar4 = cmGlobalGenerator::IsReservedTarget(psVar12);
    if ((bVar5 || bVar6) || bVar4) {
      if (bVar4) goto LAB_0032e6c4;
      goto LAB_0032e6de;
    }
    lVar10 = std::__cxx11::string::find((char)psVar12,0x3a);
    if (lVar10 != -1) goto LAB_0032e6c4;
    if (!bVar5) goto LAB_0032e7db;
LAB_0032e6e3:
    psVar12 = local_88;
    pcVar3 = local_90;
    if ((local_98 & 1) == 0) {
      if ((local_9c & 1) == 0) {
        if ((local_a0 & 1) == 0) {
          if (!bVar6) {
            pcVar11 = cmMakefile::FindTargetToUse(local_90,local_88,false);
            if (pcVar11 == (cmTarget *)0x0) {
              cmMakefile::AddImportedTarget(pcVar3,psVar12,EXECUTABLE,global);
              return true;
            }
            local_d8._24_8_ = (psVar12->_M_dataplus)._M_p;
            local_d8._16_8_ = psVar12->_M_string_length;
            local_d8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1f;
            local_d8._8_8_ = "cannot create imported target \"";
            local_b8[0] = ';';
            local_b8[1] = '\0';
            local_b8[2] = '\0';
            local_b8[3] = '\0';
            local_b8[4] = '\0';
            local_b8[5] = '\0';
            local_b8[6] = '\0';
            local_b8[7] = '\0';
            local_b0 = "\" because another target with the same name already exists.";
            views._M_len = 3;
            views._M_array = (iterator)local_d8;
            cmCatViews_abi_cxx11_((string *)&local_60,views);
            std::__cxx11::string::_M_assign((string *)&local_a8->Error);
            local_80.field_2._M_allocated_capacity = local_50[0]._M_allocated_capacity;
            local_80._M_dataplus._M_p = (pointer)local_60._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_allocated_capacity == local_50) {
              return false;
            }
            goto LAB_0032eb71;
          }
          bVar5 = cmGeneratorExpression::IsValidTargetName(local_88);
          if (bVar5) goto LAB_0032e9d0;
LAB_0032e986:
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"Invalid name for ALIAS: ",psVar12);
          std::__cxx11::string::_M_assign((string *)&local_a8->Error);
          local_80.field_2._M_allocated_capacity = local_d8._16_8_;
          local_80._M_dataplus._M_p = (pointer)local_d8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_d8 + 0x10)) {
            return false;
          }
          goto LAB_0032eb71;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",""
                  );
        std::__cxx11::string::_M_assign((string *)&local_a8->Error);
      }
      else {
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"may not be given MACOSX_BUNDLE for an IMPORTED target.","");
        std::__cxx11::string::_M_assign((string *)&local_a8->Error);
      }
    }
    else {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"may not be given WIN32 for an IMPORTED target.","");
      std::__cxx11::string::_M_assign((string *)&local_a8->Error);
    }
  }
  else {
LAB_0032e6c4:
    bVar4 = cmMakefile::CheckCMP0037(local_90,psVar12,EXECUTABLE);
    if (!bVar4) {
      return false;
    }
LAB_0032e6de:
    psVar12 = local_88;
    if (bVar5) goto LAB_0032e6e3;
    if (!bVar6) {
LAB_0032e7db:
      psVar12 = local_88;
      pcVar3 = local_90;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_d8 + 0x10);
      local_d8._8_8_ = (char *)0x0;
      local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
      local_d8._0_8_ = paVar1;
      bVar5 = cmMakefile::EnforceUniqueName(local_90,local_88,(string *)local_d8,false);
      if (bVar5) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ != paVar1) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_60._M_local_buf,__first,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_d8);
        pcVar11 = cmMakefile::AddExecutable
                            (pcVar3,psVar12,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_60,(bool)((byte)local_a0 & 1));
        if ((local_98 & 1) != 0) {
          local_d8._0_8_ = paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"WIN32_EXECUTABLE","");
          cmTarget::SetProperty(pcVar11,(string *)local_d8,"ON");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._0_8_ != paVar1) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
        }
        if ((local_9c & 1) != 0) {
          local_d8._0_8_ = paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"MACOSX_BUNDLE","");
          cmTarget::SetProperty(pcVar11,(string *)local_d8,"ON");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._0_8_ != paVar1) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_60);
        return true;
      }
      std::__cxx11::string::_M_assign((string *)&local_a8->Error);
      goto LAB_0032eb62;
    }
    bVar5 = cmGeneratorExpression::IsValidTargetName(local_88);
    pcVar3 = local_90;
    if (!bVar5) goto LAB_0032e986;
    if ((local_a0 & 1) == 0) {
      if (global == false) {
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0x60) {
          bVar5 = cmMakefile::IsAlias(local_90,__first._M_current);
          if (bVar5) {
            local_d8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1c;
            local_d8._8_8_ = "cannot create ALIAS target \"";
            local_60._8_8_ = (psVar12->_M_dataplus)._M_p;
            local_60._M_allocated_capacity = psVar12->_M_string_length;
            cmStrCat<char[19],std::__cxx11::string,char[22]>
                      (&local_80,(cmAlphaNum *)local_d8,(cmAlphaNum *)&local_60,
                       (char (*) [19])"\" because target \"",__first._M_current,
                       (char (*) [22])"\" is itself an ALIAS.");
            std::__cxx11::string::_M_assign((string *)&local_a8->Error);
          }
          else {
            pcVar11 = cmMakefile::FindTargetToUse(pcVar3,__first._M_current,true);
            if (pcVar11 == (cmTarget *)0x0) {
              local_d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1c;
              local_d8._8_8_ = "cannot create ALIAS target \"";
              local_60._8_8_ = (psVar12->_M_dataplus)._M_p;
              local_60._M_allocated_capacity = psVar12->_M_string_length;
              cmStrCat<char[19],std::__cxx11::string,char[26]>
                        (&local_80,(cmAlphaNum *)local_d8,(cmAlphaNum *)&local_60,
                         (char (*) [19])"\" because target \"",__first._M_current,
                         (char (*) [26])"\" does not already exist.");
              std::__cxx11::string::_M_assign((string *)&local_a8->Error);
            }
            else {
              TVar8 = cmTarget::GetType(pcVar11);
              if (TVar8 == EXECUTABLE) {
                bVar5 = cmTarget::IsImported(pcVar11);
                bVar6 = true;
                if (bVar5) {
                  bVar6 = cmTarget::IsImportedGloballyVisible(pcVar11);
                }
                cmMakefile::AddAlias(local_90,local_88,__first._M_current,bVar6);
                return true;
              }
              local_d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1c;
              local_d8._8_8_ = "cannot create ALIAS target \"";
              local_60._8_8_ = (psVar12->_M_dataplus)._M_p;
              local_60._M_allocated_capacity = psVar12->_M_string_length;
              cmStrCat<char[19],std::__cxx11::string,char[24]>
                        (&local_80,(cmAlphaNum *)local_d8,(cmAlphaNum *)&local_60,
                         (char (*) [19])"\" because target \"",__first._M_current,
                         (char (*) [24])"\" is not an executable.");
              std::__cxx11::string::_M_assign((string *)&local_a8->Error);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p == &local_80.field_2) {
            return false;
          }
          goto LAB_0032eb71;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"ALIAS requires exactly one target argument.","");
        std::__cxx11::string::_M_assign((string *)&local_a8->Error);
        goto LAB_0032eb62;
      }
LAB_0032e9d0:
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"IMPORTED with ALIAS is not allowed.","");
      std::__cxx11::string::_M_assign((string *)&local_a8->Error);
    }
    else {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
      std::__cxx11::string::_M_assign((string *)&local_a8->Error);
    }
  }
LAB_0032eb62:
  local_80.field_2._M_allocated_capacity = local_d8._16_8_;
  local_80._M_dataplus._M_p = (pointer)local_d8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_d8 + 0x10)) {
    return false;
  }
LAB_0032eb71:
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmAddExecutableCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  auto s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      status.SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      status.SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      status.SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      status.SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", exename,
                               "\" because target \"", aliasedName,
                               "\" is not an executable."));
      return false;
    }
    mf.AddAlias(exename, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(exename)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", exename,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(exename, cmStateEnums::EXECUTABLE, importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(exename, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = mf.AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}